

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O0

void __thiscall
trun::TestResponseProxy::Begin
          (TestResponseProxy *this,string *use_symbolName,string *use_moduleName)

{
  ILogger *pIVar1;
  allocator<char> local_41;
  string local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *use_moduleName_local;
  string *use_symbolName_local;
  TestResponseProxy *this_local;
  
  local_20 = use_moduleName;
  use_moduleName_local = use_symbolName;
  use_symbolName_local = (string *)this;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->symbolName,use_symbolName);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->moduleName,local_20);
  this->errorCount = 0;
  this->assertCount = 0;
  this->testResult = kTestResult_Pass;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"TestResponseProxy",&local_41);
  pIVar1 = gnilk::Logger::GetLogger(&local_40);
  this->pLogger = pIVar1;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  Timer::Reset(&this->timer);
  trun::AssertError::Reset(&this->assertError);
  return;
}

Assistant:

void TestResponseProxy::Begin(const std::string &use_symbolName, const std::string &use_moduleName) {
    symbolName = use_symbolName;
    moduleName = use_moduleName;
    errorCount = 0;
    assertCount = 0;
    testResult = kTestResult_Pass;
    pLogger = gnilk::Logger::GetLogger("TestResponseProxy");

    // Reset the timer
    timer.Reset();
    assertError.Reset();
}